

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_progress.c
# Opt level: O1

int xferinfo_cb(void *clientp,curl_off_t dltotal,curl_off_t dlnow,curl_off_t ultotal,
               curl_off_t ulnow)

{
  int iVar1;
  
  *(curl_off_t *)((long)clientp + 0x188) = dltotal;
  *(curl_off_t *)((long)clientp + 400) = dlnow;
  *(curl_off_t *)((long)clientp + 0x198) = ultotal;
  *(curl_off_t *)((long)clientp + 0x1a0) = ulnow;
  iVar1 = 1;
  if ((*(char *)((long)clientp + 0x1d4) == '\0') &&
     (iVar1 = 0, *(char *)(*(long *)((long)clientp + 0x10) + 0x342) == '\x01')) {
    *(undefined1 *)(*(long *)((long)clientp + 0x10) + 0x342) = 0;
    iVar1 = 0;
    curl_easy_pause(*(undefined8 *)((long)clientp + 0x20),0);
  }
  return iVar1;
}

Assistant:

int xferinfo_cb(void *clientp,
                curl_off_t dltotal,
                curl_off_t dlnow,
                curl_off_t ultotal,
                curl_off_t ulnow)
{
  struct per_transfer *per = clientp;
  struct OperationConfig *config = per->config;
  per->dltotal = dltotal;
  per->dlnow = dlnow;
  per->ultotal = ultotal;
  per->ulnow = ulnow;

  if(per->abort)
    return 1;

  if(config->readbusy) {
    config->readbusy = FALSE;
    curl_easy_pause(per->curl, CURLPAUSE_CONT);
  }

  return 0;
}